

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

void OpenHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  AnonADIOSFile *this;
  mapped_type *ppAVar3;
  string strMode;
  key_type local_90;
  CMConnection local_88;
  char *local_80;
  char *local_78;
  char local_70 [16];
  string local_60;
  ulong local_40;
  int64_t local_38;
  
  local_88 = conn;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Streaming","");
  if (*(int *)((long)vevent + 0x10) == 1) {
    std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x1332f9);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Got an open request (mode ",0x1a);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_80,(long)local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") for file ",0xb);
  __s = *(char **)((long)vevent + 8);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  this = (AnonADIOSFile *)operator_new(0x78);
  std::__cxx11::string::string
            ((string *)&local_60,*(char **)((long)vevent + 8),(allocator *)&local_90);
  AnonADIOSFile::AnonADIOSFile
            (this,&local_60,*(RemoteFileMode *)((long)vevent + 0x10),
             *(int *)((long)vevent + 0x14) != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_38 = this->m_ID;
  local_40 = (ulong)*vevent;
  CMwrite(conn,*(undefined8 *)((long)client_data + 0x18));
  CMconn_register_close_handler(conn,ConnCloseHandler,0);
  local_90 = this->m_ID;
  ppAVar3 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&ADIOSFileMap,&local_90);
  *ppAVar3 = this;
  std::
  _Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<_CMConnection*&,long&>
            ((_Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&ConnToFileMap,0,&local_88,&this->m_ID);
  ADIOSFilesOpened = ADIOSFilesOpened + 1;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return;
}

Assistant:

static void OpenHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                        attr_list attrs)
{
    OpenFileMsg open_msg = static_cast<OpenFileMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _OpenResponseMsg open_response_msg;
    std::string strMode = "Streaming";
    if (open_msg->Mode == RemoteOpenRandomAccess)
        strMode = "RandomAccess";
    std::cout << "Got an open request (mode " << strMode << ") for file " << open_msg->FileName
              << std::endl;
    AnonADIOSFile *f =
        new AnonADIOSFile(open_msg->FileName, open_msg->Mode, open_msg->RowMajorOrder);
    memset(&open_response_msg, 0, sizeof(open_response_msg));
    open_response_msg.FileHandle = f->m_ID;
    open_response_msg.OpenResponseCondition = open_msg->OpenResponseCondition;
    CMwrite(conn, ev_state->OpenResponseFormat, &open_response_msg);
    CMconn_register_close_handler(conn, ConnCloseHandler, NULL);
    ADIOSFileMap[f->m_ID] = f;
    ConnToFileMap.emplace(conn, f->m_ID);
    ADIOSFilesOpened++;
    last_service_time = std::chrono::steady_clock::now();
}